

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::SynchWaitParams::SynchWaitParams
          (SynchWaitParams *this,MuHow how_arg,Condition *cond_arg,KernelTimeout timeout_arg,
          Mutex *cvmu_arg,PerThreadSynch *thread_arg,atomic<long> *cv_word_arg)

{
  int64_t iVar1;
  PerThreadSynch *thread_arg_local;
  Mutex *cvmu_arg_local;
  Condition *cond_arg_local;
  MuHow how_arg_local;
  SynchWaitParams *this_local;
  KernelTimeout timeout_arg_local;
  
  this->how = how_arg;
  this->cond = cond_arg;
  (this->timeout).rep_ = timeout_arg.rep_;
  this->cvmu = cvmu_arg;
  this->thread = thread_arg;
  this->cv_word = cv_word_arg;
  iVar1 = base_internal::CycleClock::Now();
  this->contention_start_cycles = iVar1;
  this->should_submit_contention_data = false;
  return;
}

Assistant:

SynchWaitParams(Mutex::MuHow how_arg, const Condition* cond_arg,
                  KernelTimeout timeout_arg, Mutex* cvmu_arg,
                  PerThreadSynch* thread_arg,
                  std::atomic<intptr_t>* cv_word_arg)
      : how(how_arg),
        cond(cond_arg),
        timeout(timeout_arg),
        cvmu(cvmu_arg),
        thread(thread_arg),
        cv_word(cv_word_arg),
        contention_start_cycles(CycleClock::Now()),
        should_submit_contention_data(false) {}